

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

IOFileUD * io_file_new(lua_State *L)

{
  IOFileUD *pIVar1;
  ulong uVar2;
  long in_RDI;
  GCudata *ud;
  IOFileUD *iof;
  
  pIVar1 = (IOFileUD *)lua_newuserdata((lua_State *)iof,(size_t)ud);
  uVar2 = (ulong)*(uint *)(*(long *)(in_RDI + 0x18) + -8);
  *(undefined1 *)(uVar2 + 6) = 1;
  *(undefined4 *)(uVar2 + 0x10) =
       *(undefined4 *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8) + 8);
  pIVar1->fp = (FILE *)0x0;
  pIVar1->type = 0;
  return pIVar1;
}

Assistant:

static IOFileUD *io_file_new(lua_State *L)
{
  IOFileUD *iof = (IOFileUD *)lua_newuserdata(L, sizeof(IOFileUD));
  GCudata *ud = udataV(L->top-1);
  ud->udtype = UDTYPE_IO_FILE;
  /* NOBARRIER: The GCudata is new (marked white). */
  setgcrefr(ud->metatable, curr_func(L)->c.env);
  iof->fp = NULL;
  iof->type = IOFILE_TYPE_FILE;
  return iof;
}